

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RunHighs.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  HighsLogOptions *report_log_options;
  bool bVar1;
  int iVar2;
  int iVar3;
  long *plVar4;
  long *plVar5;
  string usage_msg;
  HighsCommandLineOptions cmd_options;
  App app;
  HighsOptions loaded_options;
  Highs highs;
  allocator local_5be9;
  long *local_5be8;
  long local_5be0;
  long local_5bd8;
  long lStack_5bd0;
  long *local_5bc8;
  long local_5bc0;
  long local_5bb8;
  long lStack_5bb0;
  string local_5b68;
  string local_5b48;
  undefined1 *local_5b28 [2];
  undefined1 local_5b18 [16];
  undefined1 *local_5b08 [2];
  undefined1 local_5af8 [16];
  HighsCommandLineOptions local_5ae8;
  undefined1 local_5950 [864];
  HighsOptions local_55f0;
  Highs local_51f0;
  
  Highs::Highs(&local_51f0);
  HighsCommandLineOptions::HighsCommandLineOptions(&local_5ae8);
  HighsOptions::HighsOptions(&local_55f0);
  std::__cxx11::string::_M_replace
            ((ulong)&local_55f0.super_HighsOptionsStruct.log_file,0,
             (char *)local_55f0.super_HighsOptionsStruct.log_file._M_string_length,0x144611);
  local_5b48._M_dataplus._M_p = (pointer)&local_5b48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b48,"");
  local_5b68._M_dataplus._M_p = (pointer)&local_5b68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b68,"");
  CLI::App::App((App *)local_5950,&local_5b48,&local_5b68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b68._M_dataplus._M_p != &local_5b68.field_2) {
    operator_delete(local_5b68._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b48._M_dataplus._M_p != &local_5b48.field_2) {
    operator_delete(local_5b48._M_dataplus._M_p);
  }
  setupCommandLineOptions((App *)local_5950,&local_5ae8);
  std::__cxx11::string::string((string *)local_5b28,*argv,&local_5be9);
  plVar4 = (long *)std::__cxx11::string::replace((ulong)local_5b28,0,(char *)0x0,0x14461b);
  plVar5 = plVar4 + 2;
  if ((long *)*plVar4 == plVar5) {
    local_5bb8 = *plVar5;
    lStack_5bb0 = plVar4[3];
    local_5bc8 = &local_5bb8;
  }
  else {
    local_5bb8 = *plVar5;
    local_5bc8 = (long *)*plVar4;
  }
  local_5bc0 = plVar4[1];
  *plVar4 = (long)plVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_5bc8);
  plVar5 = plVar4 + 2;
  if ((long *)*plVar4 == plVar5) {
    local_5bd8 = *plVar5;
    lStack_5bd0 = plVar4[3];
    local_5be8 = &local_5bd8;
  }
  else {
    local_5bd8 = *plVar5;
    local_5be8 = (long *)*plVar4;
  }
  local_5be0 = plVar4[1];
  *plVar4 = (long)plVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_5bc8 != &local_5bb8) {
    operator_delete(local_5bc8);
  }
  if (local_5b28[0] != local_5b18) {
    operator_delete(local_5b28[0]);
  }
  local_5b08[0] = local_5af8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_5b08,local_5be8,local_5be0 + (long)local_5be8);
  std::__cxx11::string::operator=((string *)(local_5950 + 0xf0),(string *)local_5b08);
  if (local_5b08[0] != local_5af8) {
    operator_delete(local_5b08[0]);
  }
  CLI::App::parse_char_t<char>((App *)local_5950,argc,argv);
  report_log_options = &local_51f0.options_.super_HighsOptionsStruct.log_options;
  if (local_5be8 != &local_5bd8) {
    operator_delete(local_5be8);
  }
  bVar1 = loadOptions((App *)local_5950,report_log_options,&local_5ae8,&local_55f0);
  iVar2 = -1;
  if (bVar1) {
    if (local_55f0.super_HighsOptionsStruct.output_flag == true) {
      Highs::openLogFile((string *)&local_51f0);
    }
    Highs::passOptions((HighsOptions *)&local_51f0);
    local_5be8 = &local_5bd8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_5be8,"");
    Highs::writeOptions((string *)&local_51f0,SUB81(&local_5be8,0));
    if (local_5be8 != &local_5bd8) {
      operator_delete(local_5be8);
    }
    iVar2 = Highs::readModel((string *)&local_51f0);
    if (iVar2 == -1) {
      highsLogUser(report_log_options,kInfo,"Error loading file\n");
      iVar2 = -1;
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)&local_5ae8.cmd_read_basis_file);
      if ((iVar2 == 0) || (iVar2 = Highs::readBasis((string *)&local_51f0), iVar2 != -1)) {
        iVar2 = std::__cxx11::string::compare((char *)&local_5ae8.read_solution_file);
        if ((iVar2 == 0) ||
           (iVar2 = Highs::readSolution((string *)&local_51f0,(int)&local_5ae8.read_solution_file),
           iVar2 != -1)) {
          if (local_51f0.options_.super_HighsOptionsStruct.write_presolved_model_to_file == true) {
            iVar3 = Highs::presolve();
            iVar2 = -1;
            if (iVar3 != -1) {
              if (((uint)local_51f0.model_presolve_status_ < 6) &&
                 ((0x39U >> (local_51f0.model_presolve_status_ & 0x1f) & 1) != 0)) {
                iVar2 = Highs::writePresolvedModel((string *)&local_51f0);
              }
              else {
                highsLogUser(report_log_options,kInfo,"No presolved model to write to file\n");
                iVar2 = iVar3;
              }
            }
          }
          else {
            iVar3 = Highs::run();
            iVar2 = -1;
            if (iVar3 != -1) {
              iVar2 = std::__cxx11::string::compare((char *)&local_5ae8.cmd_write_basis_file);
              if ((iVar2 == 0) || (iVar2 = Highs::writeBasis((string *)&local_51f0), iVar2 != -1)) {
                if ((local_51f0.options_.super_HighsOptionsStruct.write_solution_to_file != false)
                   || (iVar2 = std::__cxx11::string::compare
                                         ((char *)&local_51f0.options_.super_HighsOptionsStruct.
                                                   solution_file), iVar2 != 0)) {
                  Highs::writeSolution((string *)&local_51f0,(int)&local_51f0 + 0xb38);
                }
                iVar2 = iVar3;
                if ((local_51f0.options_.super_HighsOptionsStruct.write_model_to_file == true) &&
                   (iVar3 = Highs::writeModel((string *)&local_51f0), iVar3 == -1)) {
                  iVar2 = -1;
                }
              }
              else {
                highsLogUser(report_log_options,kInfo,"Error writing basis to file\n");
                iVar2 = -1;
              }
            }
          }
        }
        else {
          highsLogUser(report_log_options,kInfo,"Error loading solution file\n");
          iVar2 = -1;
        }
      }
      else {
        highsLogUser(report_log_options,kInfo,"Error reading basis from file\n");
        iVar2 = -1;
      }
    }
  }
  CLI::App::~App((App *)local_5950);
  HighsOptions::~HighsOptions(&local_55f0);
  HighsCommandLineOptions::~HighsCommandLineOptions(&local_5ae8);
  Highs::~Highs(&local_51f0);
  return iVar2;
}

Assistant:

int main(int argc, char** argv) {
  // Create the Highs instance.
  Highs highs;
  const HighsOptions& options = highs.getOptions();
  const HighsLogOptions& log_options = options.log_options;

  // Load user options.
  HighsCommandLineOptions cmd_options;
  HighsOptions loaded_options;

  // Set "HiGHS.log" as the default log_file for the app so that
  // log_file has this value if it isn't set in the file
  loaded_options.log_file = "HiGHS.log";
  // When loading the options file, any messages are reported using
  // the default HighsLogOptions

  // Replace command line options parsing library
  // cxxopts now Cpp17 with
  // CLI11 for Cpp11

  CLI::App app{""};
  argv = app.ensure_utf8(argv);

  setupCommandLineOptions(app, cmd_options);

  try {
    std::string usage_msg =
        "usage:\n      " + std::string(argv[0]) + " [options] [file]";
    app.usage(usage_msg);

    app.parse(argc, argv);
  } catch (const CLI::CallForHelp& e) {
    std::cout << app.help() << std::endl;
    return 0;
  } catch (const CLI::CallForAllHelp& e) {
    std::cout << app.help();
    return 0;
  } catch (const CLI::RequiredError& e) {
    std::cout << "Please specify filename in .mps|.lp|.ems format."
              << std::endl;
    return (int)HighsStatus::kError;
  } catch (const CLI::ExtrasError& e) {
    std::cout << e.what() << std::endl;
    std::cout << "Multiple files not supported." << std::endl;
    return (int)HighsStatus::kError;
  } catch (const CLI::ArgumentMismatch& e) {
    std::cout << e.what() << std::endl;
    std::cout << "Too many arguments provided. Please provide only one."
              << std::endl;
    return (int)HighsStatus::kError;
  } catch (const CLI::ParseError& e) {
    std::cout << e.what() << std::endl;
    // app.exit() should be called from main.
    return app.exit(e);
  }

  if (!loadOptions(app, log_options, cmd_options, loaded_options))
    return (int)HighsStatus::kError;

  // Open the app log file - unless output_flag is false, to avoid
  // creating an empty file. It does nothing if its name is "".
  if (loaded_options.output_flag) highs.openLogFile(loaded_options.log_file);

  // Pass the option settings to HiGHS. Only error-checking produces
  // output, but values are checked in loadOptions, so it's safe to
  // call this first so that printHighsVersionCopyright uses reporting
  // settings defined in any options file.
  highs.passOptions(loaded_options);
  //  highs.writeOptions("Options.md");
  highs.writeOptions("", true);

  // Load the model from model_file
  HighsStatus read_status = highs.readModel(cmd_options.model_file);
  if (read_status == HighsStatus::kError) {
    highsLogUser(log_options, HighsLogType::kInfo, "Error loading file\n");
    return (int)read_status;
  }

  if (cmd_options.cmd_read_basis_file != "") {
    HighsStatus basis_status = highs.readBasis(cmd_options.cmd_read_basis_file);
    if (basis_status == HighsStatus::kError) {
      highsLogUser(log_options, HighsLogType::kInfo,
                   "Error reading basis from file\n");
      return (int)basis_status;
    }
  }

  // Possible read a solution file
  if (cmd_options.read_solution_file != "") {
    HighsStatus read_solution_status =
        highs.readSolution(cmd_options.read_solution_file);
    if (read_solution_status == HighsStatus::kError) {
      highsLogUser(log_options, HighsLogType::kInfo,
                   "Error loading solution file\n");
      return (int)read_solution_status;
    }
  }
  if (options.write_presolved_model_to_file) {
    // Run presolve and write the presolved model to a file
    HighsStatus status = highs.presolve();
    if (status == HighsStatus::kError) return int(status);
    HighsPresolveStatus model_presolve_status = highs.getModelPresolveStatus();
    const bool ok_to_write =
        model_presolve_status == HighsPresolveStatus::kNotReduced ||
        model_presolve_status == HighsPresolveStatus::kReduced ||
        model_presolve_status == HighsPresolveStatus::kReducedToEmpty ||
        model_presolve_status == HighsPresolveStatus::kTimeout;
    if (!ok_to_write) {
      highsLogUser(log_options, HighsLogType::kInfo,
                   "No presolved model to write to file\n");
      return int(status);
    }
    status = highs.writePresolvedModel(options.write_presolved_model_file);
    return int(status);
  }
  // Solve the model
  HighsStatus run_status = highs.run();
  if (run_status == HighsStatus::kError) return int(run_status);

  // highs.writeInfo("Info.md");

  if (cmd_options.cmd_write_basis_file != "") {
    HighsStatus basis_status =
        highs.writeBasis(cmd_options.cmd_write_basis_file);
    if (basis_status == HighsStatus::kError) {
      highsLogUser(log_options, HighsLogType::kInfo,
                   "Error writing basis to file\n");

      return (int)basis_status;
    }
  }

  // Possibly write the solution to a file
  if (options.write_solution_to_file || options.solution_file != "")
    highs.writeSolution(options.solution_file, options.write_solution_style);

  // Possibly write the model to a file
  if (options.write_model_to_file) {
    HighsStatus write_model_status = highs.writeModel(options.write_model_file);
    if (write_model_status == HighsStatus::kError)
      return (int)write_model_status;  // todo: change to write model error
  }

  // Shut down task executor: optional and wip
  // HighsTaskExecutor::shutdown(true);

  return (int)run_status;
}